

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
::
nosize_unchecked_emplace_at<std::pair<slang::ast::InstanceCacheKey&&,slang::ast::DiagnosticVisitor::InstanceCacheEntry&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,slang::ast::DiagnosticVisitor::InstanceCacheEntry>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceCacheKey,void>,std::equal_to<slang::ast::InstanceCacheKey>,std::allocator<std::pair<slang::ast::InstanceCacheKey_const,slang::ast::DiagnosticVisitor::InstanceCacheEntry>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<slang::ast::InstanceCacheKey_&&,_slang::ast::DiagnosticVisitor::InstanceCacheEntry_&&>
          *args)

{
  group_type_pointer pgVar1;
  undefined8 *puVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  InstanceCacheKey *pIVar5;
  InstanceCacheEntry *pIVar6;
  uint uVar7;
  ushort uVar8;
  pointer ppVar9;
  _Storage<const_slang::ast::Compilation::InstanceSideEffects_*,_true> _Var10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  pgVar3 = arrays_->groups_;
  lVar11 = pos0 * 0x10;
  pgVar1 = pgVar3 + pos0;
  auVar15[0] = -(pgVar1->m[0].n == '\0');
  auVar15[1] = -(pgVar1->m[1].n == '\0');
  auVar15[2] = -(pgVar1->m[2].n == '\0');
  auVar15[3] = -(pgVar1->m[3].n == '\0');
  auVar15[4] = -(pgVar1->m[4].n == '\0');
  auVar15[5] = -(pgVar1->m[5].n == '\0');
  auVar15[6] = -(pgVar1->m[6].n == '\0');
  auVar15[7] = -(pgVar1->m[7].n == '\0');
  auVar15[8] = -(pgVar1->m[8].n == '\0');
  auVar15[9] = -(pgVar1->m[9].n == '\0');
  auVar15[10] = -(pgVar1->m[10].n == '\0');
  auVar15[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar15[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar15[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar15[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar15[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar13 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
  if (uVar13 == 0) {
    uVar12 = arrays_->groups_size_mask;
    lVar14 = 1;
    do {
      pgVar3[pos0].m[0xf].n = pgVar3[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar14 & uVar12;
      lVar11 = pos0 * 0x10;
      pgVar1 = pgVar3 + pos0;
      auVar16[0] = -(pgVar1->m[0].n == '\0');
      auVar16[1] = -(pgVar1->m[1].n == '\0');
      auVar16[2] = -(pgVar1->m[2].n == '\0');
      auVar16[3] = -(pgVar1->m[3].n == '\0');
      auVar16[4] = -(pgVar1->m[4].n == '\0');
      auVar16[5] = -(pgVar1->m[5].n == '\0');
      auVar16[6] = -(pgVar1->m[6].n == '\0');
      auVar16[7] = -(pgVar1->m[7].n == '\0');
      auVar16[8] = -(pgVar1->m[8].n == '\0');
      auVar16[9] = -(pgVar1->m[9].n == '\0');
      auVar16[10] = -(pgVar1->m[10].n == '\0');
      auVar16[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar16[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar16[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar16[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar16[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar8 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe;
      uVar13 = (uint)uVar8;
      lVar14 = lVar14 + 1;
    } while (uVar8 == 0);
  }
  ppVar4 = arrays_->elements_;
  uVar7 = 0;
  if (uVar13 != 0) {
    for (; (uVar13 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
    }
  }
  uVar12 = (ulong)(uVar7 << 6);
  pIVar5 = args->first;
  *(InstanceSymbol **)((long)&ppVar4[pos0 * 0xf].first.symbol.ptr + uVar12) = (pIVar5->symbol).ptr;
  ppVar9 = (pIVar5->ifaceKeys).
           super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (undefined8 *)
           ((long)&ppVar4[pos0 * 0xf].first.ifaceKeys.
                   super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar12);
  *puVar2 = (pIVar5->ifaceKeys).
            super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2[1] = ppVar9;
  *(pointer *)
   ((long)&ppVar4[pos0 * 0xf].first.ifaceKeys.
           super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar12) =
       (pIVar5->ifaceKeys).
       super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pIVar5->ifaceKeys).
  super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar5->ifaceKeys).
  super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar5->ifaceKeys).
  super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(size_t *)((long)&ppVar4[pos0 * 0xf].first.savedHash + uVar12) = pIVar5->savedHash;
  pIVar6 = args->second;
  *(undefined8 *)
   (&ppVar4[pos0 * 0xf].second.sideEffects.
     super__Optional_base<const_slang::ast::Compilation::InstanceSideEffects_*,_true,_true>.
     _M_payload.super__Optional_payload_base<const_slang::ast::Compilation::InstanceSideEffects_*>.
     _M_engaged + uVar12) =
       *(undefined8 *)
        &(pIVar6->sideEffects).
         super__Optional_base<const_slang::ast::Compilation::InstanceSideEffects_*,_true,_true>.
         _M_payload.
         super__Optional_payload_base<const_slang::ast::Compilation::InstanceSideEffects_*>.
         _M_engaged;
  _Var10 = (pIVar6->sideEffects).
           super__Optional_base<const_slang::ast::Compilation::InstanceSideEffects_*,_true,_true>.
           _M_payload.
           super__Optional_payload_base<const_slang::ast::Compilation::InstanceSideEffects_*>.
           _M_payload;
  puVar2 = (undefined8 *)((long)&ppVar4[pos0 * 0xf].second.canonicalBody.ptr + uVar12);
  *puVar2 = (pIVar6->canonicalBody).ptr;
  *(_Storage<const_slang::ast::Compilation::InstanceSideEffects_*,_true> *)(puVar2 + 1) = _Var10;
  (pgVar3->m + lVar11)[uVar7].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + ((uint)hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar3->m + lVar11);
  __return_storage_ptr__->n = uVar7;
  __return_storage_ptr__->p =
       (pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>
        *)((long)&ppVar4[pos0 * 0xf].first.symbol.ptr + uVar12);
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }